

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangularSolverMatrix.h
# Opt level: O3

void Eigen::internal::triangular_solve_matrix<double,_long,_1,_5,_false,_0,_0,_1>::run
               (long size,long otherSize,double *_tri,long triStride,double *_other,long otherIncr,
               long otherStride,level3_blocking<double,_double> *blocking)

{
  double dVar1;
  RhsScalar *pRVar2;
  ulong stride;
  int iVar3;
  LhsScalar *pLVar4;
  ulong uVar5;
  undefined8 *puVar6;
  ulong uVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  LhsScalar *pLVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  long lVar16;
  long lVar17;
  double *pdVar18;
  ulong uVar19;
  double local_198;
  ulong local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  ulong local_168;
  long local_160;
  long local_158;
  RhsScalar *local_150;
  double *local_148;
  double *local_140;
  double *local_138;
  double *local_130;
  ulong local_128;
  long local_120;
  double *local_118;
  double *local_110;
  double *local_108;
  ulong local_100;
  LhsScalar *local_f8;
  RhsScalar *local_f0;
  long local_e8;
  double *local_e0;
  double *local_d8;
  double *local_d0;
  long local_c8;
  double *local_c0;
  long local_b8;
  double *local_b0;
  ulong local_a8;
  double *local_a0;
  long local_98;
  RhsScalar *local_90;
  long local_88;
  ulong local_80;
  long local_78;
  ulong local_70;
  ulong local_68;
  LhsScalar *local_60;
  blas_data_mapper<double,_long,_0,_0,_1> local_58;
  gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_0,_false,_true>
  local_41;
  double *pdStack_40;
  gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_0,_false,_true>
  pack_rhs;
  gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_4,_false,_false>
  local_32;
  gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_0,_false,_false>
  local_31 [7];
  gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_4,_false,_false>
  gebp_kernel;
  gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_0,_false,_false>
  pack_lhs;
  
  pLVar12 = &local_198;
  local_c8 = triStride;
  local_138 = _tri;
  if (otherIncr != 1) {
    __assert_fail("incr==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/util/BlasUtil.h"
                  ,0xae,
                  "Eigen::internal::blas_data_mapper<double, long, 0>::blas_data_mapper(Scalar *, Index, Index) [Scalar = double, Index = long, StorageOrder = 0, AlignmentType = 0, Incr = 1]"
                 );
  }
  local_70 = size;
  lVar11 = blocking->m_mc;
  if (size <= blocking->m_mc) {
    lVar11 = size;
  }
  local_68 = blocking->m_kc;
  uVar19 = lVar11 * blocking->m_kc;
  if (uVar19 >> 0x3d != 0) {
LAB_0013cc3f:
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = std::random_device::_M_fini;
    __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_b8 = lVar11;
  if (blocking->m_blockA == (LhsScalar *)0x0) {
    if (uVar19 < 0x4001) {
      pLVar4 = (LhsScalar *)((long)&local_198 - (uVar19 * 8 + 0x1e & 0xfffffffffffffff0));
      local_60 = pLVar4;
      pLVar12 = pLVar4;
    }
    else {
      pLVar4 = (LhsScalar *)malloc(uVar19 * 8);
      if (((ulong)pLVar4 & 0xf) != 0) goto LAB_0013ccda;
      local_60 = pLVar4;
      pLVar12 = &local_198;
      if (pLVar4 == (LhsScalar *)0x0) goto LAB_0013cc3f;
    }
  }
  else {
    local_60 = blocking->m_blockA;
    pLVar4 = (LhsScalar *)0x0;
    pLVar12 = &local_198;
  }
  uVar7 = local_68 * otherSize;
  local_a8 = uVar7;
  if (0x1fffffffffffffff < uVar7) {
    pLVar12[-1] = 6.41063515251455e-318;
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = std::random_device::_M_fini;
    pLVar12[-1] = 6.41081301614705e-318;
    __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_90 = blocking->m_blockB;
  if (blocking->m_blockB == (RhsScalar *)0x0) {
    if (uVar7 < 0x4001) {
      local_f0 = (RhsScalar *)((long)pLVar12 - (uVar7 * 8 + 0x1e & 0xfffffffffffffff0));
      local_90 = local_f0;
      pLVar12 = local_f0;
    }
    else {
      pLVar12[-1] = 6.40197418174295e-318;
      local_f0 = (RhsScalar *)malloc(uVar7 * 8);
      if (((ulong)local_f0 & 0xf) != 0) {
LAB_0013ccda:
        *(undefined8 *)((long)pLVar12 + -8) = 0x13ccf9;
        __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/util/Memory.h"
                      ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
      }
      local_90 = local_f0;
      if (local_f0 == (RhsScalar *)0x0) {
        pLVar12[-1] = 6.41132684441873e-318;
        puVar6 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar6 = std::random_device::_M_fini;
        pLVar12[-1] = (LhsScalar)&LAB_0013cd27;
        __cxa_throw(puVar6,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
      }
    }
  }
  else {
    local_f0 = (RhsScalar *)0x0;
  }
  local_100 = uVar19;
  local_98 = otherSize;
  local_f8 = pLVar4;
  if (manage_caching_sizes(Eigen::Action,long*,long*,long*)::m_cacheSizes == '\0') {
    pLVar12[-1] = 6.41087230402455e-318;
    iVar3 = __cxa_guard_acquire(&manage_caching_sizes(Eigen::Action,long*,long*,long*)::m_cacheSizes
                               );
    if (iVar3 != 0) {
      pLVar12[-1] = 6.41097111715372e-318;
      CacheSizes::CacheSizes
                ((CacheSizes *)&manage_caching_sizes(Eigen::Action,long*,long*,long*)::m_cacheSizes)
      ;
      pLVar12[-1] = 6.41103040503122e-318;
      __cxa_guard_release(&manage_caching_sizes(Eigen::Action,long*,long*,long*)::m_cacheSizes);
      otherSize = local_98;
    }
  }
  if (otherSize < 1) {
    local_b0 = (double *)0x0;
  }
  else {
    uVar19 = local_70;
    if ((long)local_70 < otherStride) {
      uVar19 = otherStride;
    }
    uVar7 = DAT_001dcb70 / (uVar19 << 5);
    uVar19 = uVar7 + 3;
    if (-1 < (long)uVar7) {
      uVar19 = uVar7;
    }
    local_b0 = (double *)(uVar19 & 0xfffffffffffffffc);
  }
  if ((long)local_b0 < 5) {
    local_b0 = (double *)0x4;
  }
  if (0 < (long)local_70) {
    local_130 = local_138 + 1;
    local_198 = (double)(local_c8 * 8 + 8);
    local_160 = local_68 * (long)local_198;
    local_180 = local_c8 * 0x20 + 0x20;
    local_108 = _other + 1;
    local_158 = local_68 * 8;
    local_170 = otherStride * (long)local_b0 * 8;
    local_120 = local_70 - local_68;
    local_118 = _other + local_68;
    local_178 = local_b8 * 8;
    local_110 = local_138 + local_68;
    local_78 = 0;
    local_128 = local_70;
    uVar19 = local_70;
    do {
      local_168 = local_128;
      if ((long)local_68 < (long)local_128) {
        local_168 = local_68;
      }
      uVar7 = uVar19 - local_78;
      if ((long)local_68 < (long)(uVar19 - local_78)) {
        uVar7 = local_68;
      }
      local_80 = uVar7;
      if (0 < local_98) {
        local_c0 = local_108;
        lVar11 = 0;
        do {
          local_88 = lVar11;
          local_a0 = (double *)(local_98 - lVar11);
          pdVar13 = local_a0;
          if ((long)local_b0 < (long)local_a0) {
            pdVar13 = local_b0;
          }
          local_d0 = pdVar13;
          if (0 < (long)uVar7) {
            local_150 = local_90 + lVar11 * uVar7;
            local_148 = _other + lVar11 * otherStride;
            local_140 = local_c0;
            local_d8 = local_130;
            lVar10 = 0;
            uVar19 = local_168;
            do {
              stride = local_80;
              pdVar14 = local_d0;
              pRVar2 = local_150;
              local_190 = uVar19;
              uVar5 = 4;
              if ((long)uVar19 < 4) {
                uVar5 = uVar19;
              }
              if ((long)uVar5 < 2) {
                uVar5 = 1;
              }
              local_e0 = (double *)(uVar7 - lVar10);
              pdVar18 = (double *)0x4;
              if ((long)local_e0 < 4) {
                pdVar18 = local_e0;
              }
              local_e8 = lVar10;
              pdStack_40 = (double *)(local_78 + lVar10);
              if (0 < (long)local_e0) {
                uVar19 = 0;
                pdVar8 = local_140;
                pdVar9 = local_d8;
                do {
                  if (0 < (long)local_a0) {
                    pdVar15 = pdVar8;
                    lVar16 = local_88;
                    do {
                      if (0 < (long)(~uVar19 + (long)pdVar18)) {
                        dVar1 = _other[(long)pdStack_40 + lVar16 * otherStride + uVar19];
                        lVar17 = 0;
                        do {
                          pdVar15[lVar17] = pdVar9[lVar17] * -dVar1 + pdVar15[lVar17];
                          lVar17 = lVar17 + 1;
                        } while (lVar17 < (long)(~uVar19 + (long)pdVar18));
                      }
                      lVar16 = lVar16 + 1;
                      pdVar15 = pdVar15 + otherStride;
                    } while (lVar16 < (long)pdVar13 + lVar11);
                  }
                  uVar19 = uVar19 + 1;
                  pdVar9 = (double *)((long)pdVar9 + (long)local_198);
                  pdVar8 = pdVar8 + 1;
                } while (uVar19 != uVar5);
              }
              local_58.m_data = local_148 + (long)pdStack_40;
              local_58.m_stride = otherStride;
              pLVar12[-2] = (LhsScalar)lVar10;
              pLVar12[-3] = 6.40635160336511e-318;
              gemm_pack_rhs<double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_0,_false,_true>
              ::operator()(&local_41,pRVar2,&local_58,(long)pdVar18,(long)pdVar14,stride,
                           (long)pLVar12[-2]);
              pLVar4 = local_60;
              pdVar14 = (double *)((long)local_e0 - (long)pdVar18);
              if (0 < (long)pdVar14) {
                local_188 = (long)pdVar18 + (long)pdStack_40;
                local_58.m_data =
                     local_138 + (long)pdStack_40 * local_c8 + (long)pdVar18 + (long)pdStack_40;
                local_58.m_stride = local_c8;
                pdStack_40 = pdVar18;
                local_e0 = pdVar14;
                pLVar12[-2] = 0.0;
                pLVar12[-3] = 6.40691977885782e-318;
                gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_0,_false,_false>
                ::operator()(local_31,pLVar4,(const_blas_data_mapper<double,_long,_0> *)&local_58,
                             (long)pdVar18,(long)pdVar14,0,(long)pLVar12[-2]);
                pdVar18 = pdStack_40;
                pLVar4 = local_60;
                pdVar14 = local_e0;
                pRVar2 = local_150;
                local_58.m_data = local_148 + local_188;
                local_58.m_stride = otherStride;
                pLVar12[-2] = (LhsScalar)local_e8;
                pLVar12[-3] = 0.0;
                pLVar12[-4] = (LhsScalar)local_80;
                pLVar12[-5] = (LhsScalar)pdVar18;
                pLVar12[-6] = (LhsScalar)local_d0;
                pLVar12[-7] = 6.40738914122137e-318;
                gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_4,_false,_false>
                ::operator()(&local_32,&local_58,pLVar4,pRVar2,(long)pdVar14,(long)pdVar18,
                             (long)pLVar12[-6],-1.0,(long)pLVar12[-5],(long)pLVar12[-4],
                             (long)pLVar12[-3],(long)pLVar12[-2]);
              }
              lVar10 = local_e8 + 4;
              uVar19 = local_190 - 4;
              local_d8 = (double *)((long)local_d8 + local_180);
              local_140 = local_140 + 4;
              uVar7 = local_80;
            } while (lVar10 < (long)local_80);
          }
          lVar11 = local_88 + (long)local_b0;
          local_c0 = (double *)((long)local_c0 + local_170);
        } while (lVar11 < local_98);
      }
      lVar10 = local_78 + local_68;
      local_78 = lVar10;
      uVar19 = local_70;
      pdVar13 = local_110;
      pdVar14 = local_118;
      lVar11 = local_120;
      if ((long)local_70 <= lVar10) break;
      do {
        pLVar4 = local_60;
        lVar17 = lVar11 - local_b8;
        lVar16 = lVar11;
        if (local_b8 <= lVar11) {
          lVar16 = local_b8;
        }
        lVar11 = lVar17;
        if (0 < lVar16) {
          local_88 = lVar17;
          local_a0 = pdVar14;
          pdStack_40 = pdVar13;
          local_58.m_data = pdVar13;
          local_58.m_stride = local_c8;
          pLVar12[-2] = 0.0;
          pLVar12[-3] = 6.40869347452639e-318;
          gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,___attribute__((__vector_size__(2_*_sizeof(double))))_double,_0,_false,_false>
          ::operator()(local_31,pLVar4,(const_blas_data_mapper<double,_long,_0> *)&local_58,uVar7,
                       lVar16,0,(long)pLVar12[-2]);
          local_58.m_data = local_a0;
          local_58.m_stride = otherStride;
          pLVar12[-3] = 0.0;
          pLVar12[-2] = 0.0;
          pLVar12[-4] = -NAN;
          pLVar12[-5] = -NAN;
          pLVar12[-6] = (LhsScalar)local_98;
          pLVar4 = local_60;
          uVar19 = local_80;
          pRVar2 = local_90;
          pLVar12[-7] = 6.40918754017224e-318;
          gebp_kernel<double,_double,_long,_Eigen::internal::blas_data_mapper<double,_long,_0,_0,_1>,_4,_4,_false,_false>
          ::operator()(&local_32,&local_58,pLVar4,pRVar2,lVar16,uVar19,(long)pLVar12[-6],-1.0,
                       (long)pLVar12[-5],(long)pLVar12[-4],(long)pLVar12[-3],(long)pLVar12[-2]);
          uVar19 = local_70;
          pdVar13 = pdStack_40;
          pdVar14 = local_a0;
          uVar7 = local_80;
          lVar11 = local_88;
        }
        lVar10 = lVar10 + local_b8;
        pdVar14 = (double *)((long)pdVar14 + local_178);
        pdVar13 = (double *)((long)pdVar13 + local_178);
      } while (lVar10 < (long)uVar19);
      local_128 = local_128 - local_68;
      local_130 = (double *)((long)local_130 + local_160);
      local_108 = (double *)((long)local_108 + local_158);
      local_120 = local_120 - local_68;
      local_118 = (double *)((long)local_118 + local_158);
      local_110 = (double *)((long)local_110 + local_160);
    } while (local_78 < (long)uVar19);
  }
  pRVar2 = local_f0;
  if (0x4000 < local_a8) {
    pLVar12[-1] = 6.41000768914433e-318;
    free(pRVar2);
  }
  pLVar4 = local_f8;
  if (0x4000 < local_100) {
    pLVar12[-1] = 6.41013120555579e-318;
    free(pLVar4);
  }
  return;
}

Assistant:

EIGEN_DONT_INLINE void triangular_solve_matrix<Scalar,Index,OnTheLeft,Mode,Conjugate,TriStorageOrder,ColMajor,OtherInnerStride>::run(
    Index size, Index otherSize,
    const Scalar* _tri, Index triStride,
    Scalar* _other, Index otherIncr, Index otherStride,
    level3_blocking<Scalar,Scalar>& blocking)
  {
    Index cols = otherSize;

    typedef const_blas_data_mapper<Scalar, Index, TriStorageOrder> TriMapper;
    typedef blas_data_mapper<Scalar, Index, ColMajor, Unaligned, OtherInnerStride> OtherMapper;
    TriMapper tri(_tri, triStride);
    OtherMapper other(_other, otherStride, otherIncr);

    typedef gebp_traits<Scalar,Scalar> Traits;

    enum {
      SmallPanelWidth   = EIGEN_PLAIN_ENUM_MAX(Traits::mr,Traits::nr),
      IsLower = (Mode&Lower) == Lower
    };

    Index kc = blocking.kc();                   // cache block size along the K direction
    Index mc = (std::min)(size,blocking.mc());  // cache block size along the M direction

    std::size_t sizeA = kc*mc;
    std::size_t sizeB = kc*cols;

    ei_declare_aligned_stack_constructed_variable(Scalar, blockA, sizeA, blocking.blockA());
    ei_declare_aligned_stack_constructed_variable(Scalar, blockB, sizeB, blocking.blockB());

    conj_if<Conjugate> conj;
    gebp_kernel<Scalar, Scalar, Index, OtherMapper, Traits::mr, Traits::nr, Conjugate, false> gebp_kernel;
    gemm_pack_lhs<Scalar, Index, TriMapper, Traits::mr, Traits::LhsProgress, typename Traits::LhsPacket4Packing, TriStorageOrder> pack_lhs;
    gemm_pack_rhs<Scalar, Index, OtherMapper, Traits::nr, ColMajor, false, true> pack_rhs;

    // the goal here is to subdivise the Rhs panels such that we keep some cache
    // coherence when accessing the rhs elements
    std::ptrdiff_t l1, l2, l3;
    manage_caching_sizes(GetAction, &l1, &l2, &l3);
    Index subcols = cols>0 ? l2/(4 * sizeof(Scalar) * std::max<Index>(otherStride,size)) : 0;
    subcols = std::max<Index>((subcols/Traits::nr)*Traits::nr, Traits::nr);

    for(Index k2=IsLower ? 0 : size;
        IsLower ? k2<size : k2>0;
        IsLower ? k2+=kc : k2-=kc)
    {
      const Index actual_kc = (std::min)(IsLower ? size-k2 : k2, kc);

      // We have selected and packed a big horizontal panel R1 of rhs. Let B be the packed copy of this panel,
      // and R2 the remaining part of rhs. The corresponding vertical panel of lhs is split into
      // A11 (the triangular part) and A21 the remaining rectangular part.
      // Then the high level algorithm is:
      //  - B = R1                    => general block copy (done during the next step)
      //  - R1 = A11^-1 B             => tricky part
      //  - update B from the new R1  => actually this has to be performed continuously during the above step
      //  - R2 -= A21 * B             => GEPP

      // The tricky part: compute R1 = A11^-1 B while updating B from R1
      // The idea is to split A11 into multiple small vertical panels.
      // Each panel can be split into a small triangular part T1k which is processed without optimization,
      // and the remaining small part T2k which is processed using gebp with appropriate block strides
      for(Index j2=0; j2<cols; j2+=subcols)
      {
        Index actual_cols = (std::min)(cols-j2,subcols);
        // for each small vertical panels [T1k^T, T2k^T]^T of lhs
        for (Index k1=0; k1<actual_kc; k1+=SmallPanelWidth)
        {
          Index actualPanelWidth = std::min<Index>(actual_kc-k1, SmallPanelWidth);
          // tr solve
          for (Index k=0; k<actualPanelWidth; ++k)
          {
            // TODO write a small kernel handling this (can be shared with trsv)
            Index i  = IsLower ? k2+k1+k : k2-k1-k-1;
            Index rs = actualPanelWidth - k - 1; // remaining size
            Index s  = TriStorageOrder==RowMajor ? (IsLower ? k2+k1 : i+1)
                                                 :  IsLower ? i+1 : i-rs;

            Scalar a = (Mode & UnitDiag) ? Scalar(1) : Scalar(1)/conj(tri(i,i));
            for (Index j=j2; j<j2+actual_cols; ++j)
            {
              if (TriStorageOrder==RowMajor)
              {
                Scalar b(0);
                const Scalar* l = &tri(i,s);
                typename OtherMapper::LinearMapper r = other.getLinearMapper(s,j);
                for (Index i3=0; i3<k; ++i3)
                  b += conj(l[i3]) * r(i3);

                other(i,j) = (other(i,j) - b)*a;
              }
              else
              {
                Scalar& otherij = other(i,j);
                otherij *= a;
                Scalar b = otherij;
                typename OtherMapper::LinearMapper r = other.getLinearMapper(s,j);
                typename TriMapper::LinearMapper l = tri.getLinearMapper(s,i);
                for (Index i3=0;i3<rs;++i3)
                  r(i3) -= b * conj(l(i3));
              }
            }
          }

          Index lengthTarget = actual_kc-k1-actualPanelWidth;
          Index startBlock   = IsLower ? k2+k1 : k2-k1-actualPanelWidth;
          Index blockBOffset = IsLower ? k1 : lengthTarget;

          // update the respective rows of B from other
          pack_rhs(blockB+actual_kc*j2, other.getSubMapper(startBlock,j2), actualPanelWidth, actual_cols, actual_kc, blockBOffset);

          // GEBP
          if (lengthTarget>0)
          {
            Index startTarget  = IsLower ? k2+k1+actualPanelWidth : k2-actual_kc;

            pack_lhs(blockA, tri.getSubMapper(startTarget,startBlock), actualPanelWidth, lengthTarget);

            gebp_kernel(other.getSubMapper(startTarget,j2), blockA, blockB+actual_kc*j2, lengthTarget, actualPanelWidth, actual_cols, Scalar(-1),
                        actualPanelWidth, actual_kc, 0, blockBOffset);
          }
        }
      }
      
      // R2 -= A21 * B => GEPP
      {
        Index start = IsLower ? k2+kc : 0;
        Index end   = IsLower ? size : k2-kc;
        for(Index i2=start; i2<end; i2+=mc)
        {
          const Index actual_mc = (std::min)(mc,end-i2);
          if (actual_mc>0)
          {
            pack_lhs(blockA, tri.getSubMapper(i2, IsLower ? k2 : k2-kc), actual_kc, actual_mc);

            gebp_kernel(other.getSubMapper(i2, 0), blockA, blockB, actual_mc, actual_kc, cols, Scalar(-1), -1, -1, 0, 0);
          }
        }
      }
    }
  }